

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimplifyLocals.cpp
# Opt level: O1

void __thiscall
wasm::SimplifyLocals<false,_true,_true>::~SimplifyLocals(SimplifyLocals<false,_true,_true> *this)

{
  ~SimplifyLocals(this);
  operator_delete(this,0x368);
  return;
}

Assistant:

bool isFunctionParallel() override { return true; }